

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMInstPrinter.c
# Opt level: O2

void printMSRMaskOperand(MCInst *MI,uint OpNum,SStream *O)

{
  uint uVar1;
  MCOperand *op;
  ulong uVar2;
  ulong uVar3;
  uint64_t uVar4;
  arm_sysreg reg;
  char *pcVar5;
  uint uVar6;
  
  op = MCInst_getOperand(MI,OpNum);
  uVar2 = MCOperand_getImm(op);
  uVar3 = MCOperand_getImm(op);
  uVar4 = ARM_getFeatureBits(MI->csh->mode);
  if (((uint)uVar4 >> 0xe & 1) == 0) {
    uVar6 = (uint)uVar3 & 0xf;
    if ((uVar2 & 0xfffffff0) != 0) {
      SStream_concat0(O,"spsr");
      if ((uVar3 & 0xf) == 0) {
        return;
      }
      SStream_concat0(O,"_");
      reg = ARM_SYSREG_INVALID;
      if ((uVar3 & 8) != 0) {
        SStream_concat0(O,"f");
        reg = ARM_SYSREG_SPSR_F;
      }
      if ((uVar3 & 4) != 0) {
        SStream_concat0(O,"s");
        reg = reg | ARM_SYSREG_SPSR_S;
      }
      if ((uVar3 & 2) != 0) {
        SStream_concat0(O,"x");
        reg = reg + ARM_SYSREG_SPSR_X;
      }
      if ((uVar3 & 1) != 0) {
        SStream_concat0(O,"c");
        reg = reg + ARM_SYSREG_SPSR_C;
      }
      goto LAB_001d9ab7;
    }
    if (((uint)uVar3 & 0xb) != 8 && uVar6 != 4) {
      SStream_concat0(O,"cpsr");
      if ((uVar3 & 0xf) == 0) {
        return;
      }
      SStream_concat0(O,"_");
      reg = ARM_SYSREG_INVALID;
      if ((uVar3 & 8) != 0) {
        SStream_concat0(O,"f");
        reg = ARM_SYSREG_CPSR_F;
      }
      if ((uVar3 & 4) != 0) {
        SStream_concat0(O,"s");
        reg = reg | ARM_SYSREG_CPSR_S;
      }
      if ((uVar3 & 2) != 0) {
        SStream_concat0(O,"x");
        reg = reg + ARM_SYSREG_CPSR_X;
      }
      if ((uVar3 & 1) != 0) {
        SStream_concat0(O,"c");
        reg = reg + ARM_SYSREG_CPSR_C;
      }
      goto LAB_001d9ab7;
    }
    SStream_concat0(O,"apsr_");
    if (uVar6 != 8) {
      if (uVar6 == 0xc) {
        pcVar5 = "nzcvqg";
        goto LAB_001d977c;
      }
      pcVar5 = "%g";
      goto LAB_001d9893;
    }
    pcVar5 = "nzcvq";
LAB_001d987a:
    SStream_concat0(O,pcVar5);
    reg = ARM_SYSREG_APSR_NZCVQ;
    goto LAB_001d9ab7;
  }
  uVar2 = MCOperand_getImm(op);
  uVar1 = MCInst_getOpcode(MI);
  uVar6 = (uint)uVar2;
  if ((char)uVar4 < '\0' && uVar1 == 0x9a5) {
    switch(uVar6) {
    case 0x400:
      pcVar5 = "eapsr_g";
LAB_001d9893:
      SStream_concat0(O,pcVar5 + 1);
      reg = ARM_SYSREG_APSR_G;
      break;
    case 0x401:
      SStream_concat0(O,"iapsr_g");
      reg = ARM_SYSREG_IAPSR_G;
      break;
    case 0x402:
      SStream_concat0(O,"eapsr_g");
      reg = ARM_SYSREG_EAPSR_G;
      break;
    case 0x403:
      SStream_concat0(O,"xpsr_g");
      reg = ARM_SYSREG_XPSR_G;
      break;
    default:
      switch(uVar6) {
      case 0xc00:
        pcVar5 = "apsr_nzcvqg";
LAB_001d977c:
        SStream_concat0(O,pcVar5);
        reg = ARM_SYSREG_APSR_NZCVQG;
        break;
      case 0xc01:
        SStream_concat0(O,"iapsr_nzcvqg");
        reg = ARM_SYSREG_IAPSR_NZCVQG;
        break;
      case 0xc02:
        SStream_concat0(O,"eapsr_nzcvqg");
        reg = ARM_SYSREG_EAPSR_NZCVQG;
        break;
      case 0xc03:
        SStream_concat0(O,"xpsr_nzcvqg");
        reg = ARM_SYSREG_XPSR_NZCVQG;
        break;
      default:
        goto switchD_001d972c_default;
      }
    }
    goto LAB_001d9ab7;
  }
switchD_001d972c_default:
  if ((uVar4 >> 0x28 & 1) == 0 || uVar1 != 0x9a5) {
    switch(uVar6 & 0xff) {
    case 1:
      SStream_concat0(O,"iapsr");
      reg = ARM_SYSREG_IAPSR;
      break;
    case 2:
      SStream_concat0(O,"eapsr");
      reg = ARM_SYSREG_EAPSR;
      break;
    case 3:
      SStream_concat0(O,"xpsr");
      reg = ARM_SYSREG_XPSR;
      break;
    default:
switchD_001d96e7_caseD_4:
      SStream_concat0(O,"apsr");
      reg = ARM_SYSREG_APSR;
      break;
    case 5:
switchD_001d96e7_caseD_5:
      SStream_concat0(O,"ipsr");
      reg = ARM_SYSREG_IPSR;
      break;
    case 6:
switchD_001d96e7_caseD_6:
      SStream_concat0(O,"epsr");
      reg = ARM_SYSREG_EPSR;
      break;
    case 7:
switchD_001d96e7_caseD_7:
      SStream_concat0(O,"iepsr");
      reg = ARM_SYSREG_IEPSR;
      break;
    case 8:
switchD_001d96e7_caseD_8:
      SStream_concat0(O,"msp");
      reg = ARM_SYSREG_MSP;
      break;
    case 9:
switchD_001d96e7_caseD_9:
      SStream_concat0(O,"psp");
      reg = ARM_SYSREG_PSP;
      break;
    case 0x10:
switchD_001d96e7_caseD_10:
      SStream_concat0(O,"primask");
      reg = ARM_SYSREG_PRIMASK;
      break;
    case 0x11:
switchD_001d96e7_caseD_11:
      SStream_concat0(O,"basepri");
      reg = ARM_SYSREG_BASEPRI;
      break;
    case 0x12:
switchD_001d96e7_caseD_12:
      SStream_concat0(O,"basepri_max");
      reg = ARM_SYSREG_BASEPRI_MAX;
      break;
    case 0x13:
switchD_001d96e7_caseD_13:
      SStream_concat0(O,"faultmask");
      reg = ARM_SYSREG_FAULTMASK;
      break;
    case 0x14:
switchD_001d96e7_caseD_14:
      SStream_concat0(O,"control");
      reg = ARM_SYSREG_CONTROL;
    }
  }
  else {
    switch(uVar2 & 0xff) {
    case 0:
      pcVar5 = "apsr_nzcvq";
      goto LAB_001d987a;
    case 1:
      SStream_concat0(O,"iapsr_nzcvq");
      reg = ARM_SYSREG_IAPSR_NZCVQ;
      break;
    case 2:
      SStream_concat0(O,"eapsr_nzcvq");
      reg = ARM_SYSREG_EAPSR_NZCVQ;
      break;
    case 3:
      SStream_concat0(O,"xpsr_nzcvq");
      reg = ARM_SYSREG_XPSR_NZCVQ;
      break;
    default:
      goto switchD_001d96e7_caseD_4;
    case 5:
      goto switchD_001d96e7_caseD_5;
    case 6:
      goto switchD_001d96e7_caseD_6;
    case 7:
      goto switchD_001d96e7_caseD_7;
    case 8:
      goto switchD_001d96e7_caseD_8;
    case 9:
      goto switchD_001d96e7_caseD_9;
    case 0x10:
      goto switchD_001d96e7_caseD_10;
    case 0x11:
      goto switchD_001d96e7_caseD_11;
    case 0x12:
      goto switchD_001d96e7_caseD_12;
    case 0x13:
      goto switchD_001d96e7_caseD_13;
    case 0x14:
      goto switchD_001d96e7_caseD_14;
    }
  }
LAB_001d9ab7:
  ARM_addSysReg(MI,reg);
  return;
}

Assistant:

static void printMSRMaskOperand(MCInst *MI, unsigned OpNum, SStream *O)
{
	MCOperand *Op = MCInst_getOperand(MI, OpNum);
	unsigned SpecRegRBit = (unsigned)MCOperand_getImm(Op) >> 4;
	unsigned Mask = (unsigned)MCOperand_getImm(Op) & 0xf;
	unsigned reg;
	uint64_t FeatureBits = ARM_getFeatureBits(MI->csh->mode);

	if (FeatureBits & ARM_FeatureMClass) {
		unsigned SYSm = (unsigned)MCOperand_getImm(Op);
		unsigned Opcode = MCInst_getOpcode(MI);

		// For writes, handle extended mask bits if the DSP extension is present.
		if (Opcode == ARM_t2MSR_M && (FeatureBits & ARM_FeatureDSPThumb2)) {
			switch (SYSm) {
				case 0x400: SStream_concat0(O, "apsr_g"); ARM_addSysReg(MI, ARM_SYSREG_APSR_G); return;
				case 0xc00: SStream_concat0(O, "apsr_nzcvqg"); ARM_addSysReg(MI, ARM_SYSREG_APSR_NZCVQG); return;
				case 0x401: SStream_concat0(O, "iapsr_g"); ARM_addSysReg(MI, ARM_SYSREG_IAPSR_G); return;
				case 0xc01: SStream_concat0(O, "iapsr_nzcvqg"); ARM_addSysReg(MI, ARM_SYSREG_IAPSR_NZCVQG); return;
				case 0x402: SStream_concat0(O, "eapsr_g"); ARM_addSysReg(MI, ARM_SYSREG_EAPSR_G); return;
				case 0xc02: SStream_concat0(O, "eapsr_nzcvqg"); ARM_addSysReg(MI, ARM_SYSREG_EAPSR_NZCVQG); return;
				case 0x403: SStream_concat0(O, "xpsr_g"); ARM_addSysReg(MI, ARM_SYSREG_XPSR_G); return;
				case 0xc03: SStream_concat0(O, "xpsr_nzcvqg"); ARM_addSysReg(MI, ARM_SYSREG_XPSR_NZCVQG); return;
			}
		}

		// Handle the basic 8-bit mask.
		SYSm &= 0xff;

		if (Opcode == ARM_t2MSR_M && (FeatureBits & ARM_HasV7Ops)) {
			// ARMv7-M deprecates using MSR APSR without a _<bits> qualifier as an
			// alias for MSR APSR_nzcvq.
			switch (SYSm) {
				case 0: SStream_concat0(O, "apsr_nzcvq"); ARM_addSysReg(MI, ARM_SYSREG_APSR_NZCVQ); return;
				case 1: SStream_concat0(O, "iapsr_nzcvq"); ARM_addSysReg(MI, ARM_SYSREG_IAPSR_NZCVQ); return;
				case 2: SStream_concat0(O, "eapsr_nzcvq"); ARM_addSysReg(MI, ARM_SYSREG_EAPSR_NZCVQ); return;
				case 3: SStream_concat0(O, "xpsr_nzcvq"); ARM_addSysReg(MI, ARM_SYSREG_XPSR_NZCVQ); return;
			}
		}


		switch (SYSm) {
			default: //llvm_unreachable("Unexpected mask value!");
			case  0: SStream_concat0(O, "apsr"); ARM_addSysReg(MI, ARM_SYSREG_APSR); return;
			case  1: SStream_concat0(O, "iapsr"); ARM_addSysReg(MI, ARM_SYSREG_IAPSR); return;
			case  2: SStream_concat0(O, "eapsr"); ARM_addSysReg(MI, ARM_SYSREG_EAPSR); return;
			case  3: SStream_concat0(O, "xpsr"); ARM_addSysReg(MI, ARM_SYSREG_XPSR); return;
			case  5: SStream_concat0(O, "ipsr"); ARM_addSysReg(MI, ARM_SYSREG_IPSR); return;
			case  6: SStream_concat0(O, "epsr"); ARM_addSysReg(MI, ARM_SYSREG_EPSR); return;
			case  7: SStream_concat0(O, "iepsr"); ARM_addSysReg(MI, ARM_SYSREG_IEPSR); return;
			case  8: SStream_concat0(O, "msp"); ARM_addSysReg(MI, ARM_SYSREG_MSP); return;
			case  9: SStream_concat0(O, "psp"); ARM_addSysReg(MI, ARM_SYSREG_PSP); return;
			case 16: SStream_concat0(O, "primask"); ARM_addSysReg(MI, ARM_SYSREG_PRIMASK); return;
			case 17: SStream_concat0(O, "basepri"); ARM_addSysReg(MI, ARM_SYSREG_BASEPRI); return;
			case 18: SStream_concat0(O, "basepri_max"); ARM_addSysReg(MI, ARM_SYSREG_BASEPRI_MAX); return;
			case 19: SStream_concat0(O, "faultmask"); ARM_addSysReg(MI, ARM_SYSREG_FAULTMASK); return;
			case 20: SStream_concat0(O, "control"); ARM_addSysReg(MI, ARM_SYSREG_CONTROL); return;
		}
	}

	// As special cases, CPSR_f, CPSR_s and CPSR_fs prefer printing as
	// APSR_nzcvq, APSR_g and APSRnzcvqg, respectively.
	if (!SpecRegRBit && (Mask == 8 || Mask == 4 || Mask == 12)) {
		SStream_concat0(O, "apsr_");
		switch (Mask) {
			default: // llvm_unreachable("Unexpected mask value!");
			case 4:  SStream_concat0(O, "g"); ARM_addSysReg(MI, ARM_SYSREG_APSR_G); return;
			case 8:  SStream_concat0(O, "nzcvq"); ARM_addSysReg(MI, ARM_SYSREG_APSR_NZCVQ); return;
			case 12: SStream_concat0(O, "nzcvqg"); ARM_addSysReg(MI, ARM_SYSREG_APSR_NZCVQG); return;
		}
	}

	reg = 0;
	if (SpecRegRBit) {
		SStream_concat0(O, "spsr");
		if (Mask) {
			SStream_concat0(O, "_");
			if (Mask & 8) {
				SStream_concat0(O, "f");
				reg += ARM_SYSREG_SPSR_F;
			}

			if (Mask & 4) {
				SStream_concat0(O, "s");
				reg += ARM_SYSREG_SPSR_S;
			}

			if (Mask & 2) {
				SStream_concat0(O, "x");
				reg += ARM_SYSREG_SPSR_X;
			}

			if (Mask & 1) {
				SStream_concat0(O, "c");
				reg += ARM_SYSREG_SPSR_C;
			}
			ARM_addSysReg(MI, reg);
		}
	} else {
		SStream_concat0(O, "cpsr");
		if (Mask) {
			SStream_concat0(O, "_");
			if (Mask & 8) {
				SStream_concat0(O, "f");
				reg += ARM_SYSREG_CPSR_F;
			}

			if (Mask & 4) {
				SStream_concat0(O, "s");
				reg += ARM_SYSREG_CPSR_S;
			}

			if (Mask & 2) {
				SStream_concat0(O, "x");
				reg += ARM_SYSREG_CPSR_X;
			}

			if (Mask & 1) {
				SStream_concat0(O, "c");
				reg += ARM_SYSREG_CPSR_C;
			}
			ARM_addSysReg(MI, reg);
		}
	}
}